

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

void anon_unknown.dwarf_383094::createImplicitNets
               (HierarchicalInstanceSyntax *instance,ASTContext *context,NetType *netType,
               SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>_>
               *implicitNetNames,SmallVectorBase<const_slang::ast::Symbol_*> *results)

{
  char *pcVar1;
  SyntaxKind SVar2;
  pointer pTVar3;
  PortConnectionSyntax *this;
  OrderedPortConnectionSyntax *pOVar4;
  SyntaxNode *expr;
  NamedPortConnectionSyntax *pNVar5;
  Compilation *this_00;
  NetSymbol *pNVar6;
  ParentList *pPVar7;
  long lVar8;
  long lVar9;
  pair<ska::detailv3::sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>_>::templated_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>,_bool>
  pVar10;
  const_iterator __begin1;
  Token t;
  SmallVector<slang::parsing::Token,_8UL> implicitNets;
  string_view local_128;
  iterator_base<const_slang::syntax::PortConnectionSyntax_*> local_118;
  ParentList *local_108;
  ulong local_100;
  SmallVectorBase<const_slang::ast::Symbol_*> *local_f8;
  NetType *local_f0;
  sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>,8ul>>
  *local_e8;
  SourceLocation local_e0;
  Token local_d8;
  SmallVectorBase<slang::parsing::Token> local_c8 [3];
  
  if (netType->netKind != Unknown) {
    pPVar7 = &instance->connections;
    local_118.index = 0;
    local_100 = (instance->connections).elements.size_ + 1 >> 1;
    local_e8 = (sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>,8ul>>
                *)&implicitNetNames->
                   super_flat_hash_set<std::basic_string_view<char>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char>_>,_8UL>_>
    ;
    local_118.list = pPVar7;
    local_108 = pPVar7;
    local_f8 = results;
    local_f0 = netType;
    while( true ) {
      if ((local_118.list == pPVar7) && (local_118.index == local_100)) break;
      this = slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::
             iterator_base<const_slang::syntax::PortConnectionSyntax_*>::operator*(&local_118);
      SVar2 = (this->super_SyntaxNode).kind;
      if (SVar2 == NamedPortConnection) {
        pNVar5 = slang::syntax::SyntaxNode::as<slang::syntax::NamedPortConnectionSyntax>
                           (&this->super_SyntaxNode);
        expr = &pNVar5->expr->super_SyntaxNode;
LAB_001a196a:
        if (expr != (SyntaxNode *)0x0) {
          local_c8[0].data_ = (pointer)local_c8[0].firstElement;
          local_c8[0].len = 0;
          local_c8[0].cap = 8;
          slang::ast::Expression::findPotentiallyImplicitNets(expr,context,local_c8);
          pTVar3 = local_c8[0].data_;
          lVar8 = local_c8[0].len << 4;
          for (lVar9 = 0; lVar8 != lVar9; lVar9 = lVar9 + 0x10) {
            pcVar1 = (char *)((long)&pTVar3->kind + lVar9);
            local_d8._0_8_ = *(undefined8 *)pcVar1;
            local_d8.info = *(Info **)(pcVar1 + 8);
            local_128 = slang::parsing::Token::valueText(&local_d8);
            pVar10 = ska::detailv3::
                     sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>,8ul>>
                     ::emplace<std::basic_string_view<char,std::char_traits<char>>>
                               (local_e8,&local_128);
            if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              this_00 = slang::ast::ASTContext::getCompilation(context);
              local_128 = slang::parsing::Token::valueText(&local_d8);
              local_e0 = slang::parsing::Token::location(&local_d8);
              pNVar6 = slang::BumpAllocator::
                       emplace<slang::ast::NetSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::NetType_const&>
                                 (&this_00->super_BumpAllocator,&local_128,&local_e0,local_f0);
              (pNVar6->super_ValueSymbol).declaredType.type = this_00->logicType;
              local_128._M_len = (size_t)pNVar6;
              slang::SmallVectorBase<slang::ast::Symbol_const*>::
              emplace_back<slang::ast::Symbol_const*>
                        ((SmallVectorBase<slang::ast::Symbol_const*> *)local_f8,
                         (Symbol **)&local_128);
            }
          }
          slang::SmallVectorBase<slang::parsing::Token>::~SmallVectorBase(local_c8);
          pPVar7 = local_108;
        }
      }
      else if (SVar2 == OrderedPortConnection) {
        pOVar4 = slang::syntax::SyntaxNode::as<slang::syntax::OrderedPortConnectionSyntax>
                           (&this->super_SyntaxNode);
        expr = &slang::not_null<slang::syntax::PropertyExprSyntax_*>::get(&pOVar4->expr)->
                super_SyntaxNode;
        goto LAB_001a196a;
      }
      local_118.index = local_118.index + 1;
    }
  }
  return;
}

Assistant:

void createImplicitNets(const HierarchicalInstanceSyntax& instance, const ASTContext& context,
                        const NetType& netType, SmallSet<string_view, 8>& implicitNetNames,
                        SmallVectorBase<const Symbol*>& results) {
    // If no default nettype is set, we don't create implicit nets.
    if (netType.isError())
        return;

    for (auto conn : instance.connections) {
        const PropertyExprSyntax* expr = nullptr;
        switch (conn->kind) {
            case SyntaxKind::OrderedPortConnection:
                expr = conn->as<OrderedPortConnectionSyntax>().expr;
                break;
            case SyntaxKind::NamedPortConnection:
                expr = conn->as<NamedPortConnectionSyntax>().expr;
                break;
            default:
                break;
        }

        if (!expr)
            continue;

        SmallVector<Token, 8> implicitNets;
        Expression::findPotentiallyImplicitNets(*expr, context, implicitNets);

        for (Token t : implicitNets) {
            if (implicitNetNames.emplace(t.valueText()).second) {
                auto& comp = context.getCompilation();
                auto net = comp.emplace<NetSymbol>(t.valueText(), t.location(), netType);
                net->setType(comp.getLogicType());
                results.push_back(net);
            }
        }
    }
}